

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O1

void Abc_NtkTimePrepare(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  void **ppvVar4;
  void *pvVar5;
  float *pfVar6;
  int iVar7;
  long lVar8;
  Abc_ManTime_t *pAVar9;
  long lVar10;
  long lVar11;
  
  if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
    Abc_ManTimeExpand(pNtk->pManTime,pNtk->vObjs->nSize,0);
    pVVar2 = pNtk->vObjs;
    pAVar9 = pNtk->pManTime;
    ppvVar3 = pAVar9->vArrs->pArray;
    iVar1 = pVVar2->nSize;
    lVar8 = (long)iVar1;
    if (0 < lVar8) {
      ppvVar4 = pVVar2->pArray;
      lVar10 = 0;
      do {
        pvVar5 = ppvVar4[lVar10];
        if ((pvVar5 != (void *)0x0) && ((*(uint *)((long)pvVar5 + 0x14) & 0xf) == 7)) {
          iVar7 = *(int *)((long)pvVar5 + 0x1c);
          if (*(int *)((long)pvVar5 + 0x1c) != 0) {
            iVar7 = -1000000000;
          }
          pfVar6 = (float *)ppvVar3[*(int *)((long)pvVar5 + 0x10)];
          *pfVar6 = (float)iVar7;
          pfVar6[1] = (float)iVar7;
        }
        lVar10 = lVar10 + 1;
      } while (lVar8 != lVar10);
    }
    lVar10 = (long)pNtk->vCos->nSize;
    if (0 < lVar10) {
      ppvVar4 = pNtk->vCos->pArray;
      lVar11 = 0;
      do {
        *(undefined8 *)ppvVar3[*(int *)((long)ppvVar4[lVar11] + 0x10)] = 0xce6e6b28ce6e6b28;
        lVar11 = lVar11 + 1;
      } while (lVar10 != lVar11);
    }
    ppvVar3 = pAVar9->vReqs->pArray;
    if (0 < iVar1) {
      ppvVar4 = pVVar2->pArray;
      lVar10 = 0;
      do {
        pvVar5 = ppvVar4[lVar10];
        if ((pvVar5 != (void *)0x0) && ((*(uint *)((long)pvVar5 + 0x14) & 0xf) == 7)) {
          *(undefined8 *)ppvVar3[*(int *)((long)pvVar5 + 0x10)] = 0x4e6e6b284e6e6b28;
        }
        lVar10 = lVar10 + 1;
      } while (lVar8 != lVar10);
    }
    lVar8 = (long)pNtk->vCis->nSize;
    if (0 < lVar8) {
      ppvVar4 = pNtk->vCis->pArray;
      lVar10 = 0;
      do {
        *(undefined8 *)ppvVar3[*(int *)((long)ppvVar4[lVar10] + 0x10)] = 0x4e6e6b284e6e6b28;
        lVar10 = lVar10 + 1;
      } while (lVar8 != lVar10);
    }
    return;
  }
  pAVar9 = Abc_ManTimeStart(pNtk);
  pNtk->pManTime = pAVar9;
  Abc_NtkTimeInitialize(pNtk,(Abc_Ntk_t *)0x0);
  return;
}

Assistant:

void Abc_NtkTimePrepare( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    Abc_Time_t ** ppTimes, * pTime;
    int i;
    // if there is no timing manager, allocate and initialize
    if ( pNtk->pManTime == NULL )
    {
        pNtk->pManTime = Abc_ManTimeStart(pNtk);
        Abc_NtkTimeInitialize( pNtk, NULL );
        return;
    }
    // if timing manager is given, expand it if necessary
    Abc_ManTimeExpand( pNtk->pManTime, Abc_NtkObjNumMax(pNtk), 0 );
    // clean arrivals except for PIs
    ppTimes = (Abc_Time_t **)pNtk->pManTime->vArrs->pArray;
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        pTime = ppTimes[pObj->Id];
        pTime->Fall = pTime->Rise = Abc_ObjFaninNum(pObj) ? -ABC_INFINITY : 0; // set contant node arrivals to zero
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pTime = ppTimes[pObj->Id];
        pTime->Fall = pTime->Rise = -ABC_INFINITY;
    }
    // clean required except for POs
    ppTimes = (Abc_Time_t **)pNtk->pManTime->vReqs->pArray;
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        pTime = ppTimes[pObj->Id];
        pTime->Fall = pTime->Rise = ABC_INFINITY;
    }
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        pTime = ppTimes[pObj->Id];
        pTime->Fall = pTime->Rise = ABC_INFINITY;
    }
}